

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_12,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_3> *b;
  long lVar6;
  Vector<float,_3> *pVVar7;
  float *pfVar8;
  long lVar9;
  undefined8 *puVar10;
  int col;
  undefined4 uVar11;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  Vec4 *local_d0;
  ulong local_c8;
  float local_c0 [6];
  float local_a8 [4];
  Matrix<float,_3,_4> local_98;
  undefined8 local_68;
  float fStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  float fStack_3c;
  Matrix<float,_3,_4> local_38;
  
  puVar2 = &local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar9 = 0;
      do {
        uVar11 = 0x3f800000;
        if (lVar4 != lVar9) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar9) = uVar11;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x30);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_60 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_54 = evalCtx->in[1].m_data[2];
    uStack_5c = (undefined4)uVar1;
    uStack_58 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
    local_48 = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    fStack_3c = evalCtx->in[3].m_data[2];
    uStack_44 = (undefined4)uVar1;
    uStack_40 = (undefined4)((ulong)uVar1 >> 0x20);
  }
  else {
    local_48 = 0.0;
    uStack_44 = 0;
    uStack_40 = 0;
    fStack_3c = 0.0;
    uStack_58 = 0;
    fStack_54 = 0.0;
    uStack_50 = 0;
    local_68 = 0;
    fStack_60 = 0.0;
    uStack_5c = 0;
    puVar5 = &s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      puVar10 = puVar2;
      do {
        *(undefined4 *)puVar10 = puVar5[lVar6];
        lVar6 = lVar6 + 1;
        puVar10 = (undefined8 *)((long)puVar10 + 0xc);
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  pfVar3 = (float *)&local_98;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    b = (Vector<float,_3> *)0x0;
    lVar4 = 0;
    do {
      pVVar7 = (Vector<float,_3> *)0x0;
      do {
        uVar11 = 0x3f800000;
        if (b != pVVar7) {
          uVar11 = 0;
        }
        *(undefined4 *)((long)pfVar3 + (long)pVVar7) = uVar11;
        pVVar7 = pVVar7 + 1;
      } while (pVVar7 != (Vector<float,_3> *)&DAT_00000030);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      b = (((Matrix<float,_3,_4> *)b)->m_data).m_data + 1;
    } while (lVar4 != 3);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_98.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_98.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_98.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    local_98.m_data.m_data[3].m_data[2] = evalCtx->in[3].m_data[2];
    local_98.m_data.m_data[3].m_data[0] = (float)uVar1;
    local_98.m_data.m_data[3].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    b = (Vector<float,_3> *)&DAT_01c2e280;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pfVar8 = pfVar3;
      do {
        *pfVar8 = b->m_data[lVar6];
        lVar6 = lVar6 + 1;
        pfVar8 = pfVar8 + 3;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      b = (Vector<float,_3> *)(b[1].m_data + 1);
    } while (lVar4 != 3);
  }
  matrixCompMult<float,3,4>
            (&local_38,(MatrixCaseUtils *)&local_68,&local_98,(Matrix<float,_3,_4> *)b);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] =
         local_38.m_data.m_data[0].m_data[lVar4] + local_38.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8 = local_c8 & 0xffffffff00000000;
  local_d0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_d0 + lVar4 * 4) =
         local_a8[lVar4] + local_38.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c0[4] = 0.0;
  local_c0[2] = 0.0;
  local_c0[3] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4 + 2] =
         *(float *)((long)&local_d0 + lVar4 * 4) + local_38.m_data.m_data[3].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d0 = &evalCtx->color;
  local_c8 = 0x100000000;
  local_c0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_d0 + lVar4 * 4)] = local_c0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}